

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int yaml_parser_update_buffer(yaml_parser_t *parser,size_t length)

{
  byte *pbVar1;
  yaml_char_t *pyVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_t __n;
  ulong uVar9;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  size_t raw_unread;
  size_t k;
  int high;
  int low;
  uint width;
  uchar octet;
  int incomplete;
  uint value2;
  uint value;
  size_t size;
  int first;
  size_t length_local;
  yaml_parser_t *parser_local;
  
  bVar3 = true;
  if (parser->read_handler == (yaml_read_handler_t *)0x0) {
    __assert_fail("parser->read_handler",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/reader.c"
                  ,0x92,"int yaml_parser_update_buffer(yaml_parser_t *, size_t)");
  }
  if ((parser->eof == 0) || ((parser->raw_buffer).pointer != (parser->raw_buffer).last)) {
    if (parser->unread < length) {
      if ((parser->encoding == YAML_ANY_ENCODING) &&
         (iVar6 = yaml_parser_determine_encoding(parser), iVar6 == 0)) {
        parser_local._4_4_ = 0;
      }
      else {
        if (((parser->buffer).start < (parser->buffer).pointer) &&
           ((parser->buffer).pointer < (parser->buffer).last)) {
          __n = (long)(parser->buffer).last - (long)(parser->buffer).pointer;
          memmove((parser->buffer).start,(parser->buffer).pointer,__n);
          (parser->buffer).pointer = (parser->buffer).start;
          (parser->buffer).last = (parser->buffer).start + __n;
        }
        else if ((parser->buffer).pointer == (parser->buffer).last) {
          (parser->buffer).pointer = (parser->buffer).start;
          (parser->buffer).last = (parser->buffer).start;
        }
        do {
          if (length <= parser->unread) {
            if (0x7ffffffffffffffe < parser->offset) {
              iVar6 = yaml_parser_set_reader_error(parser,"input is too long",parser->offset,-1);
              return iVar6;
            }
            return 1;
          }
          if (((!bVar3) || ((parser->raw_buffer).pointer == (parser->raw_buffer).last)) &&
             (iVar6 = yaml_parser_update_raw_buffer(parser), iVar6 == 0)) {
            return 0;
          }
          bVar3 = false;
          while ((parser->raw_buffer).pointer != (parser->raw_buffer).last) {
            incomplete = 0;
            bVar4 = false;
            high = 0;
            uVar9 = (long)(parser->raw_buffer).last - (long)(parser->raw_buffer).pointer;
            if (parser->encoding == YAML_UTF8_ENCODING) {
              bVar5 = *(parser->raw_buffer).pointer;
              if ((bVar5 & 0x80) == 0) {
                local_68 = 1;
              }
              else {
                if ((bVar5 & 0xe0) == 0xc0) {
                  local_6c = 2;
                }
                else {
                  if ((bVar5 & 0xf0) == 0xe0) {
                    local_70 = 3;
                  }
                  else {
                    local_70 = 0;
                    if ((bVar5 & 0xf8) == 0xf0) {
                      local_70 = 4;
                    }
                  }
                  local_6c = local_70;
                }
                local_68 = local_6c;
              }
              high = local_68;
              if (local_68 == 0) {
                iVar6 = yaml_parser_set_reader_error
                                  (parser,"invalid leading UTF-8 octet",parser->offset,(uint)bVar5);
                return iVar6;
              }
              if (uVar9 < local_68) {
                if (parser->eof != 0) {
                  iVar6 = yaml_parser_set_reader_error
                                    (parser,"incomplete UTF-8 octet sequence",parser->offset,-1);
                  return iVar6;
                }
                bVar4 = true;
              }
              else {
                if ((bVar5 & 0x80) == 0) {
                  local_74 = bVar5 & 0x7f;
                }
                else {
                  if ((bVar5 & 0xe0) == 0xc0) {
                    local_78 = bVar5 & 0x1f;
                  }
                  else {
                    if ((bVar5 & 0xf0) == 0xe0) {
                      local_7c = bVar5 & 0xf;
                    }
                    else {
                      if ((bVar5 & 0xf8) == 0xf0) {
                        local_80 = bVar5 & 7;
                      }
                      else {
                        local_80 = 0;
                      }
                      local_7c = local_80;
                    }
                    local_78 = local_7c;
                  }
                  local_74 = local_78;
                }
                incomplete = local_74;
                for (raw_unread = 1; raw_unread < local_68; raw_unread = raw_unread + 1) {
                  bVar5 = (parser->raw_buffer).pointer[raw_unread];
                  if ((bVar5 & 0xc0) != 0x80) {
                    iVar6 = yaml_parser_set_reader_error
                                      (parser,"invalid trailing UTF-8 octet",
                                       parser->offset + raw_unread,(uint)bVar5);
                    return iVar6;
                  }
                  incomplete = incomplete * 0x40 + (bVar5 & 0x3f);
                }
                if ((((local_68 != 1) && ((local_68 != 2 || ((uint)incomplete < 0x80)))) &&
                    ((local_68 != 3 || ((uint)incomplete < 0x800)))) &&
                   ((local_68 != 4 || ((uint)incomplete < 0x10000)))) {
                  iVar6 = yaml_parser_set_reader_error
                                    (parser,"invalid length of a UTF-8 sequence",parser->offset,-1);
                  return iVar6;
                }
                if (((0xd7ff < (uint)incomplete) && ((uint)incomplete < 0xe000)) ||
                   (0x10ffff < (uint)incomplete)) {
                  iVar6 = yaml_parser_set_reader_error
                                    (parser,"invalid Unicode character",parser->offset,incomplete);
                  return iVar6;
                }
              }
            }
            else if (parser->encoding - YAML_UTF16LE_ENCODING < 2) {
              uVar8 = (uint)(parser->encoding != YAML_UTF16LE_ENCODING);
              uVar7 = (uint)(parser->encoding == YAML_UTF16LE_ENCODING);
              if (uVar9 < 2) {
                if (parser->eof != 0) {
                  iVar6 = yaml_parser_set_reader_error
                                    (parser,"incomplete UTF-16 character",parser->offset,-1);
                  return iVar6;
                }
                bVar4 = true;
              }
              else {
                incomplete = (uint)(parser->raw_buffer).pointer[(int)uVar8] +
                             (uint)(parser->raw_buffer).pointer[(int)uVar7] * 0x100;
                if ((incomplete & 0xfc00U) == 0xdc00) {
                  iVar6 = yaml_parser_set_reader_error
                                    (parser,"unexpected low surrogate area",parser->offset,
                                     incomplete);
                  return iVar6;
                }
                if ((incomplete & 0xfc00U) == 0xd800) {
                  high = 4;
                  if (uVar9 < 4) {
                    if (parser->eof != 0) {
                      iVar6 = yaml_parser_set_reader_error
                                        (parser,"incomplete UTF-16 surrogate pair",parser->offset,-1
                                        );
                      return iVar6;
                    }
                    bVar4 = true;
                  }
                  else {
                    uVar8 = (uint)(parser->raw_buffer).pointer[(int)(uVar8 + 2)] +
                            (uint)(parser->raw_buffer).pointer[(int)(uVar7 + 2)] * 0x100;
                    if ((uVar8 & 0xfc00) != 0xdc00) {
                      iVar6 = yaml_parser_set_reader_error
                                        (parser,"expected low surrogate area",parser->offset + 2,
                                         uVar8);
                      return iVar6;
                    }
                    incomplete = (incomplete & 0x3ffU) * 0x400 + 0x10000 + (uVar8 & 0x3ff);
                  }
                }
                else {
                  high = 2;
                }
              }
            }
            if (bVar4) break;
            if ((((incomplete != 9) && (incomplete != 10)) &&
                ((incomplete != 0xd && (((uint)incomplete < 0x20 || (0x7e < (uint)incomplete))))))
               && (((incomplete != 0x85 &&
                    (((uint)incomplete < 0xa0 || (0xd7ff < (uint)incomplete)))) &&
                   ((((uint)incomplete < 0xe000 || (0xfffd < (uint)incomplete)) &&
                    (((uint)incomplete < 0x10000 || (0x10ffff < (uint)incomplete)))))))) {
              iVar6 = yaml_parser_set_reader_error
                                (parser,"control characters are not allowed",parser->offset,
                                 incomplete);
              return iVar6;
            }
            (parser->raw_buffer).pointer = (parser->raw_buffer).pointer + (uint)high;
            parser->offset = (ulong)(uint)high + parser->offset;
            bVar5 = (byte)incomplete;
            if ((uint)incomplete < 0x80) {
              pbVar1 = (parser->buffer).last;
              (parser->buffer).last = pbVar1 + 1;
              *pbVar1 = bVar5;
            }
            else if ((uint)incomplete < 0x800) {
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = (char)((uint)incomplete >> 6) + 0xc0;
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = (bVar5 & 0x3f) + 0x80;
            }
            else if ((uint)incomplete < 0x10000) {
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = (char)((uint)incomplete >> 0xc) + 0xe0;
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = ((byte)((uint)incomplete >> 6) & 0x3f) + 0x80;
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = (bVar5 & 0x3f) + 0x80;
            }
            else {
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = (char)((uint)incomplete >> 0x12) + 0xf0;
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = ((byte)((uint)incomplete >> 0xc) & 0x3f) + 0x80;
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = ((byte)((uint)incomplete >> 6) & 0x3f) + 0x80;
              pyVar2 = (parser->buffer).last;
              (parser->buffer).last = pyVar2 + 1;
              *pyVar2 = (bVar5 & 0x3f) + 0x80;
            }
            parser->unread = parser->unread + 1;
          }
        } while (parser->eof == 0);
        pyVar2 = (parser->buffer).last;
        (parser->buffer).last = pyVar2 + 1;
        *pyVar2 = '\0';
        parser->unread = parser->unread + 1;
        parser_local._4_4_ = 1;
      }
    }
    else {
      parser_local._4_4_ = 1;
    }
  }
  else {
    parser_local._4_4_ = 1;
  }
  return parser_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_update_buffer(yaml_parser_t *parser, size_t length)
{
    int first = 1;

    assert(parser->read_handler);   /* Read handler must be set. */

    /* If the EOF flag is set and the raw buffer is empty, do nothing. */

    if (parser->eof && parser->raw_buffer.pointer == parser->raw_buffer.last)
        return 1;

    /* Return if the buffer contains enough characters. */

    if (parser->unread >= length)
        return 1;

    /* Determine the input encoding if it is not known yet. */

    if (!parser->encoding) {
        if (!yaml_parser_determine_encoding(parser))
            return 0;
    }

    /* Move the unread characters to the beginning of the buffer. */

    if (parser->buffer.start < parser->buffer.pointer
            && parser->buffer.pointer < parser->buffer.last) {
        size_t size = parser->buffer.last - parser->buffer.pointer;
        memmove(parser->buffer.start, parser->buffer.pointer, size);
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start + size;
    }
    else if (parser->buffer.pointer == parser->buffer.last) {
        parser->buffer.pointer = parser->buffer.start;
        parser->buffer.last = parser->buffer.start;
    }

    /* Fill the buffer until it has enough characters. */

    while (parser->unread < length)
    {
        /* Fill the raw buffer if necessary. */

        if (!first || parser->raw_buffer.pointer == parser->raw_buffer.last) {
            if (!yaml_parser_update_raw_buffer(parser)) return 0;
        }
        first = 0;

        /* Decode the raw buffer. */

        while (parser->raw_buffer.pointer != parser->raw_buffer.last)
        {
            unsigned int value = 0, value2 = 0;
            int incomplete = 0;
            unsigned char octet;
            unsigned int width = 0;
            int low, high;
            size_t k;
            size_t raw_unread = parser->raw_buffer.last - parser->raw_buffer.pointer;

            /* Decode the next character. */

            switch (parser->encoding)
            {
                case YAML_UTF8_ENCODING:

                    /*
                     * Decode a UTF-8 character.  Check RFC 3629
                     * (http://www.ietf.org/rfc/rfc3629.txt) for more details.
                     *
                     * The following table (taken from the RFC) is used for
                     * decoding.
                     *
                     *    Char. number range |        UTF-8 octet sequence
                     *      (hexadecimal)    |              (binary)
                     *   --------------------+------------------------------------
                     *   0000 0000-0000 007F | 0xxxxxxx
                     *   0000 0080-0000 07FF | 110xxxxx 10xxxxxx
                     *   0000 0800-0000 FFFF | 1110xxxx 10xxxxxx 10xxxxxx
                     *   0001 0000-0010 FFFF | 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
                     *
                     * Additionally, the characters in the range 0xD800-0xDFFF
                     * are prohibited as they are reserved for use with UTF-16
                     * surrogate pairs.
                     */

                    /* Determine the length of the UTF-8 sequence. */

                    octet = parser->raw_buffer.pointer[0];
                    width = (octet & 0x80) == 0x00 ? 1 :
                            (octet & 0xE0) == 0xC0 ? 2 :
                            (octet & 0xF0) == 0xE0 ? 3 :
                            (octet & 0xF8) == 0xF0 ? 4 : 0;

                    /* Check if the leading octet is valid. */

                    if (!width)
                        return yaml_parser_set_reader_error(parser,
                                "invalid leading UTF-8 octet",
                                parser->offset, octet);

                    /* Check if the raw buffer contains an incomplete character. */

                    if (width > raw_unread) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-8 octet sequence",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Decode the leading octet. */

                    value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                            (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                            (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                            (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

                    /* Check and decode the trailing octets. */

                    for (k = 1; k < width; k ++)
                    {
                        octet = parser->raw_buffer.pointer[k];

                        /* Check if the octet is valid. */

                        if ((octet & 0xC0) != 0x80)
                            return yaml_parser_set_reader_error(parser,
                                    "invalid trailing UTF-8 octet",
                                    parser->offset+k, octet);

                        /* Decode the octet. */

                        value = (value << 6) + (octet & 0x3F);
                    }

                    /* Check the length of the sequence against the value. */

                    if (!((width == 1) ||
                            (width == 2 && value >= 0x80) ||
                            (width == 3 && value >= 0x800) ||
                            (width == 4 && value >= 0x10000)))
                        return yaml_parser_set_reader_error(parser,
                                "invalid length of a UTF-8 sequence",
                                parser->offset, -1);

                    /* Check the range of the value. */

                    if ((value >= 0xD800 && value <= 0xDFFF) || value > 0x10FFFF)
                        return yaml_parser_set_reader_error(parser,
                                "invalid Unicode character",
                                parser->offset, value);

                    break;

                case YAML_UTF16LE_ENCODING:
                case YAML_UTF16BE_ENCODING:

                    low = (parser->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
                    high = (parser->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

                    /*
                     * The UTF-16 encoding is not as simple as one might
                     * naively think.  Check RFC 2781
                     * (http://www.ietf.org/rfc/rfc2781.txt).
                     *
                     * Normally, two subsequent bytes describe a Unicode
                     * character.  However a special technique (called a
                     * surrogate pair) is used for specifying character
                     * values larger than 0xFFFF.
                     *
                     * A surrogate pair consists of two pseudo-characters:
                     *      high surrogate area (0xD800-0xDBFF)
                     *      low surrogate area (0xDC00-0xDFFF)
                     *
                     * The following formulas are used for decoding
                     * and encoding characters using surrogate pairs:
                     *
                     *  U  = U' + 0x10000   (0x01 00 00 <= U <= 0x10 FF FF)
                     *  U' = yyyyyyyyyyxxxxxxxxxx   (0 <= U' <= 0x0F FF FF)
                     *  W1 = 110110yyyyyyyyyy
                     *  W2 = 110111xxxxxxxxxx
                     *
                     * where U is the character value, W1 is the high surrogate
                     * area, W2 is the low surrogate area.
                     */

                    /* Check for incomplete UTF-16 character. */

                    if (raw_unread < 2) {
                        if (parser->eof) {
                            return yaml_parser_set_reader_error(parser,
                                    "incomplete UTF-16 character",
                                    parser->offset, -1);
                        }
                        incomplete = 1;
                        break;
                    }

                    /* Get the character. */

                    value = parser->raw_buffer.pointer[low]
                        + (parser->raw_buffer.pointer[high] << 8);

                    /* Check for unexpected low surrogate area. */

                    if ((value & 0xFC00) == 0xDC00)
                        return yaml_parser_set_reader_error(parser,
                                "unexpected low surrogate area",
                                parser->offset, value);

                    /* Check for a high surrogate area. */

                    if ((value & 0xFC00) == 0xD800) {

                        width = 4;

                        /* Check for incomplete surrogate pair. */

                        if (raw_unread < 4) {
                            if (parser->eof) {
                                return yaml_parser_set_reader_error(parser,
                                        "incomplete UTF-16 surrogate pair",
                                        parser->offset, -1);
                            }
                            incomplete = 1;
                            break;
                        }

                        /* Get the next character. */

                        value2 = parser->raw_buffer.pointer[low+2]
                            + (parser->raw_buffer.pointer[high+2] << 8);

                        /* Check for a low surrogate area. */

                        if ((value2 & 0xFC00) != 0xDC00)
                            return yaml_parser_set_reader_error(parser,
                                    "expected low surrogate area",
                                    parser->offset+2, value2);

                        /* Generate the value of the surrogate pair. */

                        value = 0x10000 + ((value & 0x3FF) << 10) + (value2 & 0x3FF);
                    }

                    else {
                        width = 2;
                    }

                    break;

                default:
                    assert(1);      /* Impossible. */
            }

            /* Check if the raw buffer contains enough bytes to form a character. */

            if (incomplete) break;

            /*
             * Check if the character is in the allowed range:
             *      #x9 | #xA | #xD | [#x20-#x7E]               (8 bit)
             *      | #x85 | [#xA0-#xD7FF] | [#xE000-#xFFFD]    (16 bit)
             *      | [#x10000-#x10FFFF]                        (32 bit)
             */

            if (! (value == 0x09 || value == 0x0A || value == 0x0D
                        || (value >= 0x20 && value <= 0x7E)
                        || (value == 0x85) || (value >= 0xA0 && value <= 0xD7FF)
                        || (value >= 0xE000 && value <= 0xFFFD)
                        || (value >= 0x10000 && value <= 0x10FFFF)))
                return yaml_parser_set_reader_error(parser,
                        "control characters are not allowed",
                        parser->offset, value);

            /* Move the raw pointers. */

            parser->raw_buffer.pointer += width;
            parser->offset += width;

            /* Finally put the character into the buffer. */

            /* 0000 0000-0000 007F -> 0xxxxxxx */
            if (value <= 0x7F) {
                *(parser->buffer.last++) = value;
            }
            /* 0000 0080-0000 07FF -> 110xxxxx 10xxxxxx */
            else if (value <= 0x7FF) {
                *(parser->buffer.last++) = 0xC0 + (value >> 6);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0000 0800-0000 FFFF -> 1110xxxx 10xxxxxx 10xxxxxx */
            else if (value <= 0xFFFF) {
                *(parser->buffer.last++) = 0xE0 + (value >> 12);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }
            /* 0001 0000-0010 FFFF -> 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
            else {
                *(parser->buffer.last++) = 0xF0 + (value >> 18);
                *(parser->buffer.last++) = 0x80 + ((value >> 12) & 0x3F);
                *(parser->buffer.last++) = 0x80 + ((value >> 6) & 0x3F);
                *(parser->buffer.last++) = 0x80 + (value & 0x3F);
            }

            parser->unread ++;
        }

        /* On EOF, put NUL into the buffer and return. */

        if (parser->eof) {
            *(parser->buffer.last++) = '\0';
            parser->unread ++;
            return 1;
        }

    }

    if (parser->offset >= MAX_FILE_SIZE) {
        return yaml_parser_set_reader_error(parser, "input is too long",
            parser->offset, -1);
    }

    return 1;
}